

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O0

us_internal_ssl_socket_t * ssl_on_data(us_internal_ssl_socket_t *s,void *data,int length)

{
  undefined8 *puVar1;
  int iVar2;
  uint uVar3;
  us_socket_context_t *puVar4;
  us_loop_t *puVar5;
  us_internal_ssl_socket_t *puVar6;
  undefined4 in_EDX;
  undefined8 in_RSI;
  us_internal_ssl_socket_t *in_RDI;
  int err_1;
  int just_read;
  int read;
  int err;
  int ret;
  loop_ssl_data *loop_ssl_data;
  us_loop_t *loop;
  us_internal_ssl_socket_context_t *context;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  int local_44;
  us_internal_ssl_socket_t *local_10;
  us_internal_ssl_socket_t *local_8;
  
  puVar4 = us_socket_context(0,&in_RDI->s);
  puVar5 = us_socket_context_loop(0,puVar4);
  puVar1 = (undefined8 *)(puVar5->data).ssl_data;
  *puVar1 = in_RSI;
  *(undefined4 *)(puVar1 + 2) = in_EDX;
  *(undefined4 *)((long)puVar1 + 0x14) = 0;
  puVar1[3] = in_RDI;
  *(undefined4 *)((long)puVar1 + 0x24) = 0;
  iVar2 = us_internal_ssl_socket_is_shut_down
                    ((us_internal_ssl_socket_t *)
                     CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
  local_10 = in_RDI;
  if (iVar2 == 0) {
    do {
      local_44 = 0;
      do {
        iVar2 = SSL_read((SSL *)local_10->ssl,(void *)(puVar1[1] + 0x20 + (long)local_44),
                         0x80000 - local_44);
        if (iVar2 < 1) {
          iVar2 = SSL_get_error((SSL *)local_10->ssl,iVar2);
          if ((iVar2 != 2) && (iVar2 != 3)) {
            if ((iVar2 == 1) || (iVar2 == 5)) {
              ERR_clear_error();
            }
            puVar6 = us_internal_ssl_socket_close((us_internal_ssl_socket_t *)0x106fe4);
            return puVar6;
          }
          if (*(int *)(puVar1 + 2) != 0) {
            puVar6 = us_internal_ssl_socket_close((us_internal_ssl_socket_t *)0x107003);
            return puVar6;
          }
          if (local_44 != 0) {
            local_10 = (us_internal_ssl_socket_t *)
                       (*(code *)puVar4[1].prev)(local_10,puVar1[1] + 0x20,local_44);
            iVar2 = us_socket_is_closed(0,(us_socket_t *)local_10);
            if (iVar2 != 0) {
              return local_10;
            }
          }
          if (local_10->ssl_write_wants_read != 0) {
            local_10->ssl_write_wants_read = 0;
            puVar4 = us_socket_context(0,&local_10->s);
            local_10 = (us_internal_ssl_socket_t *)(*puVar4->on_writable)(&local_10->s);
            iVar2 = us_socket_is_closed(0,(us_socket_t *)local_10);
            if (iVar2 != 0) {
              return local_10;
            }
          }
          uVar3 = SSL_get_shutdown((SSL *)local_10->ssl);
          if ((uVar3 & 2) != 0) {
            local_10 = us_internal_ssl_socket_close((us_internal_ssl_socket_t *)0x107151);
          }
          return local_10;
        }
        local_44 = iVar2 + local_44;
      } while (local_44 != 0x80000);
      local_10 = (us_internal_ssl_socket_t *)
                 (*(code *)puVar4[1].prev)(local_10,puVar1[1] + 0x20,0x80000);
      iVar2 = us_socket_is_closed(0,(us_socket_t *)local_10);
      local_8 = local_10;
    } while (iVar2 == 0);
  }
  else {
    iVar2 = SSL_shutdown((SSL *)in_RDI->ssl);
    if (iVar2 == 1) {
      local_8 = us_internal_ssl_socket_close((us_internal_ssl_socket_t *)0x106f11);
    }
    else {
      local_8 = in_RDI;
      if ((iVar2 < 0) &&
         ((iVar2 = SSL_get_error((SSL *)in_RDI->ssl,iVar2), iVar2 == 1 || (iVar2 == 5)))) {
        ERR_clear_error();
      }
    }
  }
  return local_8;
}

Assistant:

struct us_internal_ssl_socket_t *ssl_on_data(struct us_internal_ssl_socket_t *s, void *data, int length) {
    // note: this context can change when we adopt the socket!
    struct us_internal_ssl_socket_context_t *context = (struct us_internal_ssl_socket_context_t *) us_socket_context(0, &s->s);

    struct us_loop_t *loop = us_socket_context_loop(0, &context->sc);
    struct loop_ssl_data *loop_ssl_data = (struct loop_ssl_data *) loop->data.ssl_data;

    // note: if we put data here we should never really clear it (not in write either, it still should be available for SSL_write to read from!)
    loop_ssl_data->ssl_read_input = data;
    loop_ssl_data->ssl_read_input_length = length;
    loop_ssl_data->ssl_read_input_offset = 0;
    loop_ssl_data->ssl_socket = &s->s;
    loop_ssl_data->msg_more = 0;

    if (us_internal_ssl_socket_is_shut_down(s)) {

        int ret;
        if ((ret = SSL_shutdown(s->ssl)) == 1) {
            // two phase shutdown is complete here
            //printf("Two step SSL shutdown complete\n");

            return us_internal_ssl_socket_close(s);
        } else if (ret < 0) {

            int err = SSL_get_error(s->ssl, ret);

            if (err == SSL_ERROR_SSL || err == SSL_ERROR_SYSCALL) {
                // we need to clear the error queue in case these added to the thread local queue
                ERR_clear_error();
            }

        }

        // no further processing of data when in shutdown state
        return s;
    }

    // bug checking: this loop needs a lot of attention and clean-ups and check-ups
    int read = 0;
    restart:
    while (1) {
        int just_read = SSL_read(s->ssl, loop_ssl_data->ssl_read_output + LIBUS_RECV_BUFFER_PADDING + read, LIBUS_RECV_BUFFER_LENGTH - read);

        if (just_read <= 0) {
            int err = SSL_get_error(s->ssl, just_read);

            // as far as I know these are the only errors we want to handle
            if (err != SSL_ERROR_WANT_READ && err != SSL_ERROR_WANT_WRITE) {

                // clear per thread error queue if it may contain something
                if (err == SSL_ERROR_SSL || err == SSL_ERROR_SYSCALL) {
                    ERR_clear_error();
                }

                // terminate connection here
                return us_internal_ssl_socket_close(s);
            } else {
                // emit the data we have and exit

                // assume we emptied the input buffer fully or error here as well!
                if (loop_ssl_data->ssl_read_input_length) {
                    return us_internal_ssl_socket_close(s);
                }

                // cannot emit zero length to app
                if (!read) {
                    break;
                }

                s = context->on_data(s, loop_ssl_data->ssl_read_output + LIBUS_RECV_BUFFER_PADDING, read);
                if (us_socket_is_closed(0, &s->s)) {
                    return s;
                }

                break;
            }

        }

        read += just_read;

        // at this point we might be full and need to emit the data to application and start over
        if (read == LIBUS_RECV_BUFFER_LENGTH) {

            // emit data and restart
            s = context->on_data(s, loop_ssl_data->ssl_read_output + LIBUS_RECV_BUFFER_PADDING, read);
            if (us_socket_is_closed(0, &s->s)) {
                return s;
            }

            read = 0;
            goto restart;
        }
    }

    // trigger writable if we failed last write with want read
    if (s->ssl_write_wants_read) {
        s->ssl_write_wants_read = 0;

        // make sure to update context before we call (context can change if the user adopts the socket!)
        context = (struct us_internal_ssl_socket_context_t *) us_socket_context(0, &s->s);

        s = (struct us_internal_ssl_socket_t *) context->sc.on_writable(&s->s); // cast here!
        // if we are closed here, then exit
        if (us_socket_is_closed(0, &s->s)) {
            return s;
        }
    }

    // check this then?
    if (SSL_get_shutdown(s->ssl) & SSL_RECEIVED_SHUTDOWN) {
        //printf("SSL_RECEIVED_SHUTDOWN\n");

        //exit(-2);

        // not correct anyways!
        s = us_internal_ssl_socket_close(s);

        //us_
    }

    return s;
}